

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglprogrambinarycache.cpp
# Opt level: O0

void __thiscall
QOpenGLProgramBinaryCache::save(QOpenGLProgramBinaryCache *this,QByteArray *cacheKey,uint programId)

{
  bool bVar1;
  GLenum GVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  qsizetype qVar6;
  GLEnvInfo *this_00;
  char *pcVar7;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  bool ok;
  int i;
  int totalSize;
  int paddingSize;
  int headerSize;
  GLenum error;
  QOpenGLExtraFunctions *funcs;
  QOpenGLContext *context;
  QString filename;
  GLint outSize;
  uchar *blobFormatPtr;
  quint32 blobFormat;
  uchar *p;
  QByteArray blob;
  GLint blobSize;
  GLEnvInfo info;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_3;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  GLenum in_stack_fffffffffffffde8;
  uint in_stack_fffffffffffffdec;
  QOpenGLFunctions *in_stack_fffffffffffffdf0;
  QByteArray *str;
  GLsizei in_stack_fffffffffffffe08;
  GLuint in_stack_fffffffffffffe0c;
  uint uVar8;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  char local_198 [80];
  char local_148 [32];
  QString local_128;
  char local_110 [36];
  uint local_ec;
  char *local_e8;
  undefined4 local_dc;
  char *local_d8;
  QByteArray local_d0;
  char local_b8 [36];
  uint local_94;
  QByteArray local_90;
  QByteArray QStack_78;
  QByteArray QStack_60;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((ulong)in_RDI[2].context.file & 1) != 0) {
    memset(&local_90,0xaa,0x48);
    anon_unknown.dwarf_175eb32::GLEnvInfo::GLEnvInfo
              ((GLEnvInfo *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    QOpenGLContext::currentContext();
    QOpenGLContext::extraFunctions((QOpenGLContext *)0x911717);
    local_94 = 0;
    do {
      GVar2 = QOpenGLFunctions::glGetError(in_stack_fffffffffffffdf0);
      if (GVar2 == 0) break;
    } while (GVar2 != 0x507);
    QOpenGLFunctions::glGetProgramiv
              (in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,in_stack_fffffffffffffde8,
               (GLint *)0x911767);
    qVar6 = QByteArray::size(&local_90);
    this_00 = (GLEnvInfo *)(qVar6 + 0x1c);
    qVar6 = QByteArray::size(&QStack_78);
    str = (QByteArray *)((long)&(this_00->glvendor).d.d + qVar6);
    qVar6 = QByteArray::size(&QStack_60);
    iVar4 = (int)str + (int)qVar6;
    iVar3 = iVar4 + 8;
    iVar4 = (iVar4 + 0xbU & 0xfffffffc) - iVar3;
    uVar5 = iVar3 + iVar4 + local_94;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcOpenGLProgramDiskCache();
    anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)this_00,
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x91183a);
      QMessageLogger::QMessageLogger
                (in_RDI,(char *)str,(int)((ulong)this_00 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                 (char *)0x911853);
      in_stack_fffffffffffffdec = local_94;
      GVar2 = QOpenGLFunctions::glGetError((QOpenGLFunctions *)this_00);
      QMessageLogger::debug
                (local_b8,"Program binary is %d bytes, err = 0x%x, total %d",
                 (ulong)in_stack_fffffffffffffdec,(ulong)GVar2,(ulong)uVar5);
      local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
    }
    if (local_94 != 0) {
      local_d0.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_d0.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
      local_d0.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QByteArray::QByteArray(&local_d0,(long)(int)uVar5,Uninitialized);
      local_d8 = QByteArray::data(&this_00->glvendor);
      writeUInt((uchar **)0x911912,in_stack_fffffffffffffdec);
      writeUInt((uchar **)0x911924,in_stack_fffffffffffffdec);
      writeUInt((uchar **)0x911936,in_stack_fffffffffffffdec);
      writeUInt((uchar **)0x911948,in_stack_fffffffffffffdec);
      writeStr((uchar **)in_RDI,str);
      writeStr((uchar **)in_RDI,str);
      writeStr((uchar **)in_RDI,str);
      local_dc = 0;
      local_e8 = local_d8;
      writeUInt((uchar **)0x9119be,in_stack_fffffffffffffdec);
      writeUInt((uchar **)0x9119d2,in_stack_fffffffffffffdec);
      for (iVar3 = 0; iVar3 < iVar4; iVar3 = iVar3 + 1) {
        *local_d8 = '\0';
        local_d8 = local_d8 + 1;
      }
      local_ec = 0;
      QOpenGLExtraFunctions::glGetProgramBinary
                ((QOpenGLExtraFunctions *)CONCAT44(in_stack_fffffffffffffe14,iVar3),
                 in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08,(GLsizei *)in_RDI,(GLenum *)str
                 ,this_00);
      if (local_94 == local_ec) {
        writeUInt((uchar **)0x911b12,in_stack_fffffffffffffdec);
        local_128.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_128.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        local_128.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        cacheFileName((QOpenGLProgramBinaryCache *)CONCAT44(iVar4,uVar5),
                      (QByteArray *)CONCAT44(in_stack_fffffffffffffe14,iVar3));
        bVar1 = writeFile((QString *)in_RDI,str);
        uVar8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe0c);
        if ((!bVar1) &&
           (bVar1 = ::operator==((QString *)this_00,
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8)),
           bVar1)) {
          QString::operator=((QString *)&in_RDI[1].context.function,
                             (QString *)&(in_RDI->context).category);
          bVar1 = qt_ensureWritableDir((QString *)in_RDI);
          *(bool *)&in_RDI[2].context.file = bVar1;
          local_38 = &DAT_aaaaaaaaaaaaaaaa;
          local_30 = &DAT_aaaaaaaaaaaaaaaa;
          QtPrivateLogging::lcOpenGLProgramDiskCache();
          anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::
          QLoggingCategoryMacroHolder
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)this_00,
                     (QLoggingCategory *)
                     CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
          while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                   ((QLoggingCategoryMacroHolder *)&local_38), bVar1) {
            anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                      ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x911c1c);
            QMessageLogger::QMessageLogger
                      (in_RDI,(char *)str,(int)((ulong)this_00 >> 0x20),
                       (char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                       (char *)0x911c35);
            QtPrivate::asString((QString *)&in_RDI[1].context.function);
            QString::toLocal8Bit((QString *)CONCAT44(uVar8,in_stack_fffffffffffffe08));
            pcVar7 = QByteArray::constData((QByteArray *)0x911c60);
            QMessageLogger::debug
                      (local_148,"Cache location changed to \'%s\' writable = %d",pcVar7,
                       (ulong)(*(byte *)&in_RDI[2].context.file & 1));
            QByteArray::~QByteArray((QByteArray *)0x911c93);
            local_30 = (undefined1 *)((ulong)local_30 & 0xffffffffffffff00);
          }
          if (((ulong)in_RDI[2].context.file & 1) != 0) {
            cacheFileName((QOpenGLProgramBinaryCache *)CONCAT44(iVar4,uVar5),
                          (QByteArray *)CONCAT44(in_stack_fffffffffffffe14,iVar3));
            QString::operator=((QString *)this_00,
                               (QString *)
                               CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
            QString::~QString((QString *)0x911ce4);
            bVar1 = writeFile((QString *)in_RDI,str);
            uVar8 = CONCAT13(bVar1,(int3)uVar8);
          }
        }
        if ((uVar8 & 0x1000000) == 0) {
          local_48 = &DAT_aaaaaaaaaaaaaaaa;
          local_40 = &DAT_aaaaaaaaaaaaaaaa;
          QtPrivateLogging::lcOpenGLProgramDiskCache();
          anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::
          QLoggingCategoryMacroHolder
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)this_00,
                     (QLoggingCategory *)
                     CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
          while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                   ((QLoggingCategoryMacroHolder *)&local_48), bVar1) {
            anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                      ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x911d5f);
            QMessageLogger::QMessageLogger
                      (in_RDI,(char *)str,(int)((ulong)this_00 >> 0x20),
                       (char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                       (char *)0x911d78);
            QtPrivate::asString(&local_128);
            QString::toLocal8Bit((QString *)CONCAT44(uVar8,in_stack_fffffffffffffe08));
            pcVar7 = QByteArray::constData((QByteArray *)0x911d9c);
            QMessageLogger::debug(local_198,"Failed to write %s to shader cache",pcVar7);
            QByteArray::~QByteArray((QByteArray *)0x911dbf);
            local_40 = (undefined1 *)((ulong)local_40 & 0xffffffffffffff00);
          }
        }
        QString::~QString((QString *)0x911ddb);
      }
      else {
        local_28 = &DAT_aaaaaaaaaaaaaaaa;
        local_20 = &DAT_aaaaaaaaaaaaaaaa;
        QtPrivateLogging::lcOpenGLProgramDiskCache();
        anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::
        QLoggingCategoryMacroHolder
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)this_00,
                   (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8)
                  );
        while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
          anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x911aaa);
          QMessageLogger::QMessageLogger
                    (in_RDI,(char *)str,(int)((ulong)this_00 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                     (char *)0x911ac3);
          QMessageLogger::debug
                    (local_110,"glGetProgramBinary returned size %d instead of %d",(ulong)local_ec,
                     (ulong)local_94);
          local_20 = (undefined1 *)((ulong)local_20 & 0xffffffffffffff00);
        }
      }
      QByteArray::~QByteArray((QByteArray *)0x911df0);
    }
    anon_unknown.dwarf_175eb32::GLEnvInfo::~GLEnvInfo(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QOpenGLProgramBinaryCache::save(const QByteArray &cacheKey, uint programId)
{
    if (!m_cacheWritable)
        return;

    GLEnvInfo info;

    QOpenGLContext *context = QOpenGLContext::currentContext();
    QOpenGLExtraFunctions *funcs = context->extraFunctions();
    GLint blobSize = 0;
    while (true) {
        GLenum error = funcs->glGetError();
        if (error == GL_NO_ERROR || error == GL_CONTEXT_LOST)
            break;
    }
    funcs->glGetProgramiv(programId, GL_PROGRAM_BINARY_LENGTH, &blobSize);

    const int headerSize = FULL_HEADER_SIZE(info.glvendor.size() + info.glrenderer.size() + info.glversion.size());

    // Add padding to make the blob start 4-byte aligned in order to support
    // OpenGL implementations on ARM that choke on non-aligned pointers passed
    // to glProgramBinary.
    const int paddingSize = PADDING_SIZE(headerSize);

    const int totalSize = headerSize + paddingSize + blobSize;

    qCDebug(lcOpenGLProgramDiskCache, "Program binary is %d bytes, err = 0x%x, total %d", blobSize, funcs->glGetError(), totalSize);
    if (!blobSize)
        return;

    QByteArray blob(totalSize, Qt::Uninitialized);
    uchar *p = reinterpret_cast<uchar *>(blob.data());

    writeUInt(&p, BINSHADER_MAGIC);
    writeUInt(&p, BINSHADER_VERSION);
    writeUInt(&p, BINSHADER_QTVERSION);
    writeUInt(&p, sizeof(quintptr));

    writeStr(&p, info.glvendor);
    writeStr(&p, info.glrenderer);
    writeStr(&p, info.glversion);

    quint32 blobFormat = 0;
    uchar *blobFormatPtr = p;
    writeUInt(&p, blobFormat);
    writeUInt(&p, blobSize);

    for (int i = 0; i < paddingSize; ++i)
        *p++ = 0;

    GLint outSize = 0;
#if QT_CONFIG(opengles2)
    if (context->isOpenGLES() && context->format().majorVersion() < 3) {
        QMutexLocker lock(&m_mutex);
        initializeProgramBinaryOES(context);
        getProgramBinaryOES(programId, blobSize, &outSize, &blobFormat, p);
    } else
#endif
    funcs->glGetProgramBinary(programId, blobSize, &outSize, &blobFormat, p);
    if (blobSize != outSize) {
        qCDebug(lcOpenGLProgramDiskCache, "glGetProgramBinary returned size %d instead of %d", outSize, blobSize);
        return;
    }

    writeUInt(&blobFormatPtr, blobFormat);

    QString filename = cacheFileName(cacheKey);
    bool ok = writeFile(filename, blob);
    if (!ok && m_currentCacheDir == m_globalCacheDir) {
        m_currentCacheDir = m_localCacheDir;
        m_cacheWritable = qt_ensureWritableDir(m_currentCacheDir);
        qCDebug(lcOpenGLProgramDiskCache, "Cache location changed to '%s' writable = %d",
                qPrintable(m_currentCacheDir), m_cacheWritable);
        if (m_cacheWritable) {
            filename = cacheFileName(cacheKey);
            ok = writeFile(filename, blob);
        }
    }
    if (!ok)
        qCDebug(lcOpenGLProgramDiskCache, "Failed to write %s to shader cache", qPrintable(filename));
}